

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

iterator __thiscall
QMultiMap<QByteArray,_QByteArray>::insert
          (QMultiMap<QByteArray,_QByteArray> *this,QByteArray *key,QByteArray *value)

{
  QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  QMultiMap<QByteArray,_QByteArray> copy;
  pair<const_QByteArray,_QByteArray> local_60;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  local_30;
  _Alloc_node local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
          )(QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
            *)0x0;
  }
  else {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_30.d.ptr !=
        (QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
         *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
                          *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  pQVar1 = (this->d).d.ptr;
  iVar2 = std::
          _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QByteArray>,_std::_Select1st<std::pair<const_QByteArray,_QByteArray>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
          ::_M_lower_bound(&(pQVar1->m)._M_t,
                           *(_Link_type *)
                            ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8),
                           &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header,key);
  pQVar1 = (this->d).d.ptr;
  local_60.first.d.d = (key->d).d;
  local_60.first.d.ptr = (key->d).ptr;
  local_60.first.d.size = (key->d).size;
  if (&(local_60.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_60.first.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_60.first.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_28._M_t = &(pQVar1->m)._M_t;
  local_60.second.d.d = (value->d).d;
  local_60.second.d.ptr = (value->d).ptr;
  local_60.second.d.size = (value->d).size;
  if (&(local_60.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_60.second.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_60.second.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar2 = std::
          _Rb_tree<QByteArray,std::pair<QByteArray_const,QByteArray>,std::_Select1st<std::pair<QByteArray_const,QByteArray>>,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>
          ::
          _M_insert_equal_<std::pair<QByteArray_const,QByteArray>,std::_Rb_tree<QByteArray,std::pair<QByteArray_const,QByteArray>,std::_Select1st<std::pair<QByteArray_const,QByteArray>>,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>::_Alloc_node>
                    ((_Rb_tree<QByteArray,std::pair<QByteArray_const,QByteArray>,std::_Select1st<std::pair<QByteArray_const,QByteArray>>,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>
                      *)local_28._M_t,iVar2._M_node,&local_60,&local_28);
  if (&(local_60.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_60.second.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_60.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.first.d.d)->super_QArrayData,1,0x10);
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)(iterator)iVar2._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }